

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_math.h
# Opt level: O2

uint crnlib::math::bitmask_ofs(uint mask)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)mask;
  uVar1 = 0;
  if (mask != 0) {
    for (; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1) {
      uVar1 = uVar1 + 1;
    }
  }
  return uVar1;
}

Assistant:

inline uint bitmask_ofs(uint mask) {
  if (!mask)
    return 0;
  uint ofs = 0;
  while ((mask & 1U) == 0) {
    mask >>= 1U;
    ofs++;
  }
  return ofs;
}